

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<unsigned_int,_kj::Canceler::AdapterImpl<unsigned_int>_>::fulfill
          (AdapterPromiseNode<unsigned_int,_kj::Canceler::AdapterImpl<unsigned_int>_> *this,
          uint *value)

{
  uint *value_00;
  ExceptionOr<unsigned_int> local_1b8;
  uint *local_18;
  uint *value_local;
  AdapterPromiseNode<unsigned_int,_kj::Canceler::AdapterImpl<unsigned_int>_> *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (uint *)this;
    value_00 = mv<unsigned_int>(value);
    ExceptionOr<unsigned_int>::ExceptionOr(&local_1b8,value_00);
    ExceptionOr<unsigned_int>::operator=(&this->result,&local_1b8);
    ExceptionOr<unsigned_int>::~ExceptionOr(&local_1b8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }